

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O3

void net_tests::get_local_addr_for_peer_port_invoker(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  unit_test_log_t *puVar3;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  get_local_addr_for_peer_port t;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6f8;
  char *local_6f0;
  char *local_6e8;
  char *local_6e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_698;
  char *local_690;
  char *local_688;
  char *local_680;
  undefined1 local_678 [112];
  ios_base local_608 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  undefined1 local_4e0 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_688 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_680 = "";
  memset((ostringstream *)local_4e0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4e0);
  local_368[0]._M_string_length = 0;
  local_368[0].field_2._M_local_buf[0] = '\0';
  local_678[0] = (ostringstream)0x22;
  local_368[0]._M_dataplus._M_p = (pointer)&local_368[0].field_2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0,local_678,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4e0,"get_local_addr_for_peer_port",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_368,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_678);
  if ((undefined1 *)CONCAT71(local_678._1_7_,local_678[0]) != local_678 + 0x10) {
    operator_delete((undefined1 *)CONCAT71(local_678._1_7_,local_678[0]),local_678._16_8_ + 1);
  }
  local_698 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368[0]._M_dataplus._M_p;
  local_690 = local_368[0]._M_dataplus._M_p + local_368[0]._M_string_length;
  file.m_end = (iterator)0x286;
  file.m_begin = (iterator)&local_688;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file,(size_t)&local_698,msg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368[0]._M_dataplus._M_p != &local_368[0].field_2) {
    operator_delete(local_368[0]._M_dataplus._M_p,
                    CONCAT71(local_368[0].field_2._M_allocated_capacity._1_7_,
                             local_368[0].field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4e0);
  std::ios_base::~ios_base((ios_base *)(local_4e0 + 0x70));
  RegTestingSetup::RegTestingSetup((RegTestingSetup *)local_4e0);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_6a0 = "";
  memset((ostringstream *)local_678,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_678);
  paVar1 = &local_500.field_2;
  local_500._M_string_length = 0;
  local_500.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_500._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_678,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_678,"get_local_addr_for_peer_port",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_678,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_500,&local_58);
  paVar2 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_6b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p;
  local_6b0 = local_500._M_dataplus._M_p + local_500._M_string_length;
  file_00.m_end = (iterator)0x286;
  file_00.m_begin = (iterator)&local_6a8;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_00,(size_t)&local_6b8,msg_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar1) {
    operator_delete(local_500._M_dataplus._M_p,
                    CONCAT71(local_500.field_2._M_allocated_capacity._1_7_,
                             local_500.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_678);
  std::ios_base::~ios_base(local_608);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_6c0 = "";
  memset((ostringstream *)local_678,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_678);
  local_500._M_string_length = 0;
  local_500.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_500._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_678,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_678,"get_local_addr_for_peer_port",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_678,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_500,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_6d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p;
  local_6d0 = local_500._M_dataplus._M_p + local_500._M_string_length;
  file_01.m_end = (iterator)0x286;
  file_01.m_begin = (iterator)&local_6c8;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_01,(size_t)&local_6d8,msg_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar1) {
    operator_delete(local_500._M_dataplus._M_p,
                    CONCAT71(local_500.field_2._M_allocated_capacity._1_7_,
                             local_500.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_678);
  std::ios_base::~ios_base(local_608);
  get_local_addr_for_peer_port::test_method((get_local_addr_for_peer_port *)local_4e0);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_6e0 = "";
  memset((ostringstream *)local_678,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_678);
  local_500._M_string_length = 0;
  local_500.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_500._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_678,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_678,"get_local_addr_for_peer_port",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_678,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_500,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_6f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p;
  local_6f0 = local_500._M_dataplus._M_p + local_500._M_string_length;
  file_02.m_end = (iterator)0x286;
  file_02.m_begin = (iterator)&local_6e8;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_02,(size_t)&local_6f8,msg_02);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar1) {
    operator_delete(local_500._M_dataplus._M_p,
                    CONCAT71(local_500.field_2._M_allocated_capacity._1_7_,
                             local_500.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_678);
  std::ios_base::~ios_base(local_608);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_708 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_700 = "";
  memset((ostringstream *)local_678,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_678);
  local_500._M_string_length = 0;
  local_500.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_500._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_678,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_678,"get_local_addr_for_peer_port",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_678,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_500,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_718 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p;
  local_710 = local_500._M_dataplus._M_p + local_500._M_string_length;
  file_03.m_end = (iterator)0x286;
  file_03.m_begin = (iterator)&local_708;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_03,(size_t)&local_718,msg_03);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar1) {
    operator_delete(local_500._M_dataplus._M_p,
                    CONCAT71(local_500.field_2._M_allocated_capacity._1_7_,
                             local_500.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_678);
  std::ios_base::~ios_base(local_608);
  ChainTestingSetup::~ChainTestingSetup((ChainTestingSetup *)local_4e0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(get_local_addr_for_peer_port)
{
    // Test that GetLocalAddrForPeer() properly selects the address to self-advertise:
    //
    // 1. GetLocalAddrForPeer() calls GetLocalAddress() which returns an address that is
    //    not routable.
    // 2. GetLocalAddrForPeer() overrides the address with whatever the peer has told us
    //    he sees us as.
    // 2.1. For inbound connections we must override both the address and the port.
    // 2.2. For outbound connections we must override only the address.

    // Pretend that we bound to this port.
    const uint16_t bind_port = 20001;
    m_node.args->ForceSetArg("-bind", strprintf("3.4.5.6:%u", bind_port));

    // Our address:port as seen from the peer, completely different from the above.
    in_addr peer_us_addr;
    peer_us_addr.s_addr = htonl(0x02030405);
    const CService peer_us{peer_us_addr, 20002};

    // Create a peer with a routable IPv4 address (outbound).
    in_addr peer_out_in_addr;
    peer_out_in_addr.s_addr = htonl(0x01020304);
    CNode peer_out{/*id=*/0,
                   /*sock=*/nullptr,
                   /*addrIn=*/CAddress{CService{peer_out_in_addr, 8333}, NODE_NETWORK},
                   /*nKeyedNetGroupIn=*/0,
                   /*nLocalHostNonceIn=*/0,
                   /*addrBindIn=*/CAddress{},
                   /*addrNameIn=*/std::string{},
                   /*conn_type_in=*/ConnectionType::OUTBOUND_FULL_RELAY,
                   /*inbound_onion=*/false};
    peer_out.fSuccessfullyConnected = true;
    peer_out.SetAddrLocal(peer_us);

    // Without the fix peer_us:8333 is chosen instead of the proper peer_us:bind_port.
    auto chosen_local_addr = GetLocalAddrForPeer(peer_out);
    BOOST_REQUIRE(chosen_local_addr);
    const CService expected{peer_us_addr, bind_port};
    BOOST_CHECK(*chosen_local_addr == expected);

    // Create a peer with a routable IPv4 address (inbound).
    in_addr peer_in_in_addr;
    peer_in_in_addr.s_addr = htonl(0x05060708);
    CNode peer_in{/*id=*/0,
                  /*sock=*/nullptr,
                  /*addrIn=*/CAddress{CService{peer_in_in_addr, 8333}, NODE_NETWORK},
                  /*nKeyedNetGroupIn=*/0,
                  /*nLocalHostNonceIn=*/0,
                  /*addrBindIn=*/CAddress{},
                  /*addrNameIn=*/std::string{},
                  /*conn_type_in=*/ConnectionType::INBOUND,
                  /*inbound_onion=*/false};
    peer_in.fSuccessfullyConnected = true;
    peer_in.SetAddrLocal(peer_us);

    // Without the fix peer_us:8333 is chosen instead of the proper peer_us:peer_us.GetPort().
    chosen_local_addr = GetLocalAddrForPeer(peer_in);
    BOOST_REQUIRE(chosen_local_addr);
    BOOST_CHECK(*chosen_local_addr == peer_us);

    m_node.args->ForceSetArg("-bind", "");
}